

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::
int_writer<long_long,fmt::v6::basic_format_specs<char>>::dec_writer::operator()
          (dec_writer *this,char **it)

{
  char *pcVar1;
  
  pcVar1 = format_decimal<char,unsigned_long,char*,fmt::v6::internal::format_decimal<char,char*,unsigned_long>(char*,unsigned_long,int)::_lambda(char*)_1_>
                     (*it,*(undefined8 *)this,*(undefined4 *)(this + 8));
  *it = pcVar1;
  return;
}

Assistant:

void operator()(It&& it) const {
        it = internal::format_decimal<char_type>(it, abs_value, num_digits);
      }